

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2gsf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *path;
  bool bVar1;
  bool bVar2;
  uint32_t entrypoint;
  int iVar3;
  int *piVar4;
  mapped_type *pmVar5;
  bool bVar6;
  allocator local_20e9;
  string local_20e8 [55];
  allocator local_20b1;
  string local_20b0 [32];
  undefined1 local_2090 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  char *rom_ext;
  char *rom_path;
  int num_error;
  int argnum;
  uint32_t gsf_entrypoint;
  int argi;
  char *psfby;
  char libname [4096];
  char gsf_path [4096];
  uint local_30;
  bool default_load_offset;
  uint32_t load_offset;
  bool multiboot;
  char *endptr;
  long longval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  longval = (long)argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    usage(*argv);
    return 1;
  }
  _load_offset = (char *)0x0;
  bVar1 = false;
  local_30 = 0;
  bVar2 = true;
  memset(libname + 0xff8,0,0x1000);
  memset(&psfby,0,0x1000);
  _gsf_entrypoint = (char *)0x0;
  argnum = 1;
  do {
    bVar6 = false;
    if (argnum < (int)argv_local) {
      bVar6 = **(char **)(longval + (long)argnum * 8) == '-';
    }
    if (!bVar6) {
      entrypoint = 0x8000000;
      if (bVar1) {
        entrypoint = 0x2000000;
      }
      if ((bVar2) && (local_30 = 0x8000000, bVar1)) {
        local_30 = 0x2000000;
      }
      if ((int)argv_local != argnum) {
        if ((1 < (int)argv_local - argnum) && (iVar3 = strcmp(libname + 0xff8,""), iVar3 != 0)) {
          fprintf(_stderr,"Error: Unable to specify output filename for multiple inputs\n");
          return 1;
        }
        rom_path._0_4_ = 0;
        for (; argnum < (int)argv_local; argnum = argnum + 1) {
          path = *(char **)(longval + (long)argnum * 8);
          tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)path_findext(path);
          iVar3 = strcmp(libname + 0xff8,"");
          if (iVar3 == 0) {
            strcpy(libname + 0xff8,path);
            path_stripext(libname + 0xff8);
            iVar3 = strcmp((char *)&psfby,"");
            if (iVar3 == 0) {
              strcat(libname + 0xff8,".gsf");
            }
            else {
              strcat(libname + 0xff8,".minigsf");
            }
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2090);
          iVar3 = strcmp((char *)&psfby,"");
          if (iVar3 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_20b0,"_lib",&local_20b1);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_2090,(key_type *)local_20b0);
            std::__cxx11::string::operator=((string *)pmVar5,(char *)&psfby);
            std::__cxx11::string::~string(local_20b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_20b1);
          }
          if ((_gsf_entrypoint != (char *)0x0) && (iVar3 = strcmp(_gsf_entrypoint,""), iVar3 != 0))
          {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_20e8,"gsfby",&local_20e9);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_2090,(key_type *)local_20e8);
            std::__cxx11::string::operator=((string *)pmVar5,_gsf_entrypoint);
            std::__cxx11::string::~string(local_20e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_20e9);
          }
          bVar2 = rom2gsf(path,libname + 0xff8,entrypoint,local_30,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2090);
          if (!bVar2) {
            rom_path._0_4_ = (uint)rom_path + 1;
          }
          puts(libname + 0xff8);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_2090);
        }
        if ((uint)rom_path != 0) {
          fprintf(_stderr,"%d error(s)\n",(ulong)(uint)rom_path);
        }
        return (uint)((uint)rom_path != 0);
      }
      fprintf(_stderr,"Error: No input files\n");
      return 1;
    }
    iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"--help");
    if (iVar3 == 0) {
      usage(*(char **)longval);
      return 1;
    }
    iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"-m");
    if (iVar3 == 0) {
      bVar1 = true;
    }
    else {
      iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"-o");
      if (iVar3 == 0) {
        if ((int)argv_local <= argnum + 1) {
          fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                  *(undefined8 *)(longval + (long)argnum * 8));
          return 1;
        }
        strcpy(libname + 0xff8,*(char **)(longval + (long)(argnum + 1) * 8));
      }
      else {
        iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"--load");
        if (iVar3 == 0) {
          if ((int)argv_local <= argnum + 1) {
            fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                    *(undefined8 *)(longval + (long)argnum * 8));
            return 1;
          }
          endptr = (char *)strtol(*(char **)(longval + (long)(argnum + 1) * 8),(char **)&load_offset
                                  ,0x10);
          if (((*_load_offset != '\0') || (piVar4 = __errno_location(), *piVar4 == 0x22)) ||
             ((long)endptr < 0)) {
            fprintf(_stderr,"Error: Number format error \"%s\"\n",
                    *(undefined8 *)(longval + (long)(argnum + 1) * 8));
            return 1;
          }
          local_30 = (uint)endptr;
          bVar2 = false;
          if (((local_30 < 0x8000000) || (0x9ffffff < local_30)) &&
             ((local_30 < 0x2000000 || (0x203ffff < local_30)))) {
            fprintf(_stderr,"Error: Load offset 0x%08X is out of range\n",(ulong)endptr & 0xffffffff
                   );
            fprintf(_stderr,
                    "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n"
                   );
            return 1;
          }
        }
        else {
          iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"--lib");
          if (iVar3 == 0) {
            if ((int)argv_local <= argnum + 1) {
              fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                      *(undefined8 *)(longval + (long)argnum * 8));
              return 1;
            }
            strcpy((char *)&psfby,*(char **)(longval + (long)(argnum + 1) * 8));
          }
          else {
            iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"--psfby");
            if ((iVar3 != 0) &&
               (iVar3 = strcmp(*(char **)(longval + (long)argnum * 8),"--gsfby"), iVar3 != 0)) {
              fprintf(_stderr,"Error: Unknown option \"%s\"\n",
                      *(undefined8 *)(longval + (long)argnum * 8));
              return 1;
            }
            if ((int)argv_local <= argnum + 1) {
              fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                      *(undefined8 *)(longval + (long)argnum * 8));
              return 1;
            }
            _gsf_entrypoint = *(char **)(longval + (long)(argnum + 1) * 8);
          }
        }
      }
      argnum = argnum + 1;
    }
    argnum = argnum + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	bool multiboot = false;
	uint32_t load_offset = 0;
	bool default_load_offset = true;
	char gsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-m") == 0) {
			multiboot = true;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(gsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;
			default_load_offset = false;

			if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
				fprintf(stderr, "Error: Load offset 0x%08X is out of range\n", load_offset);
				fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	uint32_t gsf_entrypoint = multiboot ? 0x02000000 : 0x08000000;
	if (default_load_offset) {
		load_offset = multiboot ? 0x02000000 : 0x08000000;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: No input files\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(gsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(gsf_path, "") == 0) {
			strcpy(gsf_path, rom_path);
			path_stripext(gsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(gsf_path, ".minigsf");
			}
			else {
				strcat(gsf_path, ".gsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		if (!rom2gsf(rom_path, gsf_path, gsf_entrypoint, load_offset, tags)) {
			num_error++;
		}

		puts(gsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}